

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

inform_pid_lattice * inform_pid_lattice_alloc(inform_error *err)

{
  inform_pid_lattice *lattice;
  inform_error *err_local;
  
  err_local = (inform_error *)malloc(0x20);
  if (err_local == (inform_error *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
    err_local = (inform_error *)0x0;
  }
  else {
    err_local[0] = INFORM_SUCCESS;
    err_local[1] = INFORM_SUCCESS;
    err_local[2] = INFORM_SUCCESS;
    err_local[3] = INFORM_SUCCESS;
    err_local[4] = INFORM_SUCCESS;
    err_local[5] = INFORM_SUCCESS;
  }
  return (inform_pid_lattice *)err_local;
}

Assistant:

static inform_pid_lattice *inform_pid_lattice_alloc(inform_error *err)
{
    inform_pid_lattice *lattice = malloc(sizeof(inform_pid_lattice));
    if (!lattice)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    lattice->sources = NULL;
    lattice->top = NULL;
    lattice->bottom = NULL;

    return lattice;
}